

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverb.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_15ef52::ReverbState::earlyFaded
          (ReverbState *this,size_t offset,size_t todo,float fade,float fadeStep)

{
  float fVar1;
  float fVar2;
  DelayLineI delay;
  array<std::array<float,_256UL>,_4UL> *arr;
  size_t sVar3;
  reference pvVar4;
  reference pvVar5;
  pointer pvVar6;
  long lVar7;
  ulong in_RDX;
  span<const_std::array<float,_256UL>,_4UL> *in_RSI;
  span<const_std::array<float,_256UL>,_4UL> in_RDI;
  float in_XMM0_Da;
  float fVar8;
  float fVar9;
  float fVar10;
  float in_XMM1_Da;
  size_t late_feed_tap;
  size_t j_2;
  float fade1_1;
  float fade0_1;
  size_t td_1;
  size_t i_1;
  float fadeCount_1;
  float *out;
  float feedb_newCoeffStep;
  float feedb_oldCoeffStep;
  float feedb_oldCoeff;
  size_t feedb_tap1;
  size_t feedb_tap0;
  size_t j_1;
  float fade1;
  float fade0;
  size_t td;
  size_t i;
  float fadeCount;
  float newCoeffStep;
  float oldCoeffStep;
  float oldCoeff;
  size_t early_delay_tap1;
  size_t early_delay_tap0;
  size_t j;
  float mixY;
  float mixX;
  DelayLineI main_delay;
  DelayLineI early_delay;
  size_type in_stack_fffffffffffffe98;
  array<std::array<float,_256UL>,_4UL> *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  span<const_std::array<float,_256UL>,_4UL> *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffed8;
  value_type_conflict in_stack_fffffffffffffedc;
  float in_stack_fffffffffffffee0;
  float in_stack_fffffffffffffee4;
  undefined1 *in_stack_fffffffffffffee8;
  size_t in_stack_fffffffffffffef8;
  anon_union_8_2_a804b094_for_DelayLineI_1 aVar11;
  ulong local_e8;
  size_t local_d8;
  ulong local_d0;
  float local_c4;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  size_t local_80;
  ulong in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff90;
  float in_stack_ffffffffffffff94;
  float in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  ulong in_stack_ffffffffffffffa0;
  VecAllpass *in_stack_ffffffffffffffa8;
  span<std::array<float,_256UL>,_4UL> samples;
  DelayLineI local_30;
  float local_20;
  float local_1c;
  ulong local_18;
  span<const_std::array<float,_256UL>,_4UL> *local_10;
  
  local_30.Mask = *(size_t *)((in_RDI.mData)->_M_elems + 0x96);
  local_30.field_1 = *(anon_union_8_2_a804b094_for_DelayLineI_1 *)((in_RDI.mData)->_M_elems + 0x98);
  aVar11 = (anon_union_8_2_a804b094_for_DelayLineI_1)
           ((anon_union_8_2_a804b094_for_DelayLineI_1 *)((in_RDI.mData)->_M_elems + 0x50))->Line;
  arr = *(array<std::array<float,_256UL>,_4UL> **)((in_RDI.mData)->_M_elems + 0x7e);
  local_20 = in_XMM1_Da;
  local_1c = in_XMM0_Da;
  local_18 = in_RDX;
  local_10 = in_RSI;
  for (samples.mData = (pointer)0x0; samples.mData < (pointer)0x4;
      samples.mData = (pointer)((long)(samples.mData)->_M_elems + 1)) {
    in_stack_ffffffffffffffa8 =
         (VecAllpass *)
         ((long)local_10 - *(long *)((in_RDI.mData)->_M_elems + (long)samples.mData * 4 + 0x54));
    in_stack_ffffffffffffffa0 =
         (long)local_10 - *(long *)((in_RDI.mData)->_M_elems + (long)samples.mData * 4 + 0x56);
    in_stack_ffffffffffffff9c = (in_RDI.mData)->_M_elems[(long)samples.mData * 2 + 100];
    in_stack_ffffffffffffff98 = -in_stack_ffffffffffffff9c * local_20;
    in_stack_ffffffffffffff94 = (in_RDI.mData)->_M_elems[(long)samples.mData * 2 + 0x65] * local_20;
    in_stack_ffffffffffffff88 = 0;
    in_stack_ffffffffffffff90 = local_1c;
    while (in_stack_ffffffffffffff88 < local_18) {
      in_stack_ffffffffffffffa8 =
           (VecAllpass *)(aVar11.LineOffset & (ulong)in_stack_ffffffffffffffa8);
      in_stack_ffffffffffffffa0 = aVar11.LineOffset & in_stack_ffffffffffffffa0;
      in_stack_fffffffffffffee8 = (undefined1 *)((long)(aVar11.Line)->_M_elems + 1);
      sVar3 = maxz((size_t)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      local_80 = minz((long)in_stack_fffffffffffffee8 - sVar3,local_18 - in_stack_ffffffffffffff88);
      do {
        in_stack_ffffffffffffff90 = in_stack_ffffffffffffff90 + 1.0;
        in_stack_fffffffffffffee0 =
             in_stack_ffffffffffffff98 * in_stack_ffffffffffffff90 + in_stack_ffffffffffffff9c;
        fVar8 = in_stack_ffffffffffffff94 * in_stack_ffffffffffffff90;
        in_stack_ffffffffffffffa8 =
             (VecAllpass *)((long)&(in_stack_ffffffffffffffa8->Delay).Mask + 1);
        pvVar4 = std::array<float,_4UL>::operator[]
                           ((array<float,_4UL> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98
                           );
        in_stack_fffffffffffffedc = *pvVar4;
        in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffa0 + 1;
        pvVar4 = std::array<float,_4UL>::operator[]
                           ((array<float,_4UL> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98
                           );
        in_stack_fffffffffffffee4 =
             in_stack_fffffffffffffedc * in_stack_fffffffffffffee0 + *pvVar4 * fVar8;
        std::array<std::array<float,_256UL>,_4UL>::operator[]
                  (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        in_stack_ffffffffffffff88 = in_stack_ffffffffffffff88 + 1;
        pvVar5 = std::array<float,_256UL>::operator[]
                           (in_stack_fffffffffffffea0->_M_elems,in_stack_fffffffffffffe98);
        *pvVar5 = in_stack_fffffffffffffee4;
        local_80 = local_80 - 1;
      } while (local_80 != 0);
    }
  }
  al::span<std::array<float,_256UL>,_4UL>::span
            ((span<std::array<float,_256UL>,_4UL> *)in_stack_fffffffffffffeb0,
             (array<std::array<float,_256UL>,_4UL> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  VecAllpass::processFaded
            (in_stack_ffffffffffffffa8,samples,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
             in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88);
  for (local_98 = 0; local_98 < 4; local_98 = local_98 + 1) {
    local_a0 = (long)local_10 - *(long *)((in_RDI.mData)->_M_elems + local_98 * 4 + 0x9a);
    local_a8 = (long)local_10 - *(long *)((in_RDI.mData)->_M_elems + local_98 * 4 + 0x9c);
    fVar8 = (in_RDI.mData)->_M_elems[local_98 * 2 + 0xaa];
    fVar9 = -fVar8 * local_20;
    fVar10 = (in_RDI.mData)->_M_elems[local_98 * 2 + 0xab] * local_20;
    std::array<std::array<float,_256UL>,_4UL>::operator[]
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    pvVar6 = std::array<float,_256UL>::data((array<float,_256UL> *)0x1e4c20);
    local_c4 = local_1c;
    local_d0 = 0;
    while (local_d0 < local_18) {
      local_a0 = local_30.Mask & local_a0;
      local_a8 = local_30.Mask & local_a8;
      lVar7 = local_30.Mask + 1;
      sVar3 = maxz(local_a0,local_a8);
      local_d8 = minz(lVar7 - sVar3,local_18 - local_d0);
      do {
        local_c4 = local_c4 + 1.0;
        std::array<std::array<float,_256UL>,_4UL>::operator[]
                  (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        pvVar5 = std::array<float,_256UL>::operator[]
                           (in_stack_fffffffffffffea0->_M_elems,in_stack_fffffffffffffe98);
        fVar1 = *pvVar5;
        local_a0 = local_a0 + 1;
        pvVar4 = std::array<float,_4UL>::operator[]
                           ((array<float,_4UL> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98
                           );
        fVar2 = *pvVar4;
        local_a8 = local_a8 + 1;
        pvVar4 = std::array<float,_4UL>::operator[]
                           ((array<float,_4UL> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98
                           );
        pvVar6[local_d0] = *pvVar4 * fVar10 * local_c4 + fVar2 * (fVar9 * local_c4 + fVar8) + fVar1;
        local_d0 = local_d0 + 1;
        local_d8 = local_d8 - 1;
      } while (local_d8 != 0);
    }
  }
  for (local_e8 = 0; local_e8 < 4; local_e8 = local_e8 + 1) {
    in_stack_fffffffffffffeb0 = local_10;
    std::array<std::array<float,_256UL>,_4UL>::operator[]
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    pvVar6 = std::array<float,_256UL>::data((array<float,_256UL> *)0x1e4ecb);
    DelayLineI::write(&local_30,(int)in_stack_fffffffffffffeb0,(void *)(3 - local_e8),(size_t)pvVar6
                     );
  }
  al::span<const_std::array<float,_256UL>,_4UL>::span(in_stack_fffffffffffffeb0,arr);
  delay.field_1.LineOffset = aVar11.LineOffset;
  delay.Mask = in_stack_fffffffffffffef8;
  VectorScatterRevDelayIn
            (delay,(size_t)in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
             in_stack_fffffffffffffee0,in_RDI,
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  return;
}

Assistant:

void ReverbState::earlyFaded(const size_t offset, const size_t todo, const float fade,
    const float fadeStep)
{
    const DelayLineI early_delay{mEarly.Delay};
    const DelayLineI main_delay{mDelay};
    const float mixX{mMixX};
    const float mixY{mMixY};

    ASSUME(todo > 0);

    for(size_t j{0u};j < NUM_LINES;j++)
    {
        size_t early_delay_tap0{offset - mEarlyDelayTap[j][0]};
        size_t early_delay_tap1{offset - mEarlyDelayTap[j][1]};
        const float oldCoeff{mEarlyDelayCoeff[j][0]};
        const float oldCoeffStep{-oldCoeff * fadeStep};
        const float newCoeffStep{mEarlyDelayCoeff[j][1] * fadeStep};
        float fadeCount{fade};

        for(size_t i{0u};i < todo;)
        {
            early_delay_tap0 &= main_delay.Mask;
            early_delay_tap1 &= main_delay.Mask;
            size_t td{minz(main_delay.Mask+1 - maxz(early_delay_tap0, early_delay_tap1), todo-i)};
            do {
                fadeCount += 1.0f;
                const float fade0{oldCoeff + oldCoeffStep*fadeCount};
                const float fade1{newCoeffStep*fadeCount};
                mTempSamples[j][i++] =
                    main_delay.Line[early_delay_tap0++][j]*fade0 +
                    main_delay.Line[early_delay_tap1++][j]*fade1;
            } while(--td);
        }
    }

    mEarly.VecAp.processFaded(mTempSamples, offset, mixX, mixY, fade, fadeStep, todo);

    for(size_t j{0u};j < NUM_LINES;j++)
    {
        size_t feedb_tap0{offset - mEarly.Offset[j][0]};
        size_t feedb_tap1{offset - mEarly.Offset[j][1]};
        const float feedb_oldCoeff{mEarly.Coeff[j][0]};
        const float feedb_oldCoeffStep{-feedb_oldCoeff * fadeStep};
        const float feedb_newCoeffStep{mEarly.Coeff[j][1] * fadeStep};
        float *out{mEarlySamples[j].data()};
        float fadeCount{fade};

        for(size_t i{0u};i < todo;)
        {
            feedb_tap0 &= early_delay.Mask;
            feedb_tap1 &= early_delay.Mask;
            size_t td{minz(early_delay.Mask+1 - maxz(feedb_tap0, feedb_tap1), todo - i)};

            do {
                fadeCount += 1.0f;
                const float fade0{feedb_oldCoeff + feedb_oldCoeffStep*fadeCount};
                const float fade1{feedb_newCoeffStep*fadeCount};
                out[i] = mTempSamples[j][i] +
                    early_delay.Line[feedb_tap0++][j]*fade0 +
                    early_delay.Line[feedb_tap1++][j]*fade1;
                ++i;
            } while(--td);
        }
    }
    for(size_t j{0u};j < NUM_LINES;j++)
        early_delay.write(offset, NUM_LINES-1-j, mTempSamples[j].data(), todo);

    const size_t late_feed_tap{offset - mLateFeedTap};
    VectorScatterRevDelayIn(main_delay, late_feed_tap, mixX, mixY, mEarlySamples, todo);
}